

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwaitcondition_unix.cpp
# Opt level: O2

__pid_t __thiscall QWaitCondition::wait(QWaitCondition *this,void *__stat_loc)

{
  int *piVar1;
  StateForWaitCondition SVar2;
  int code;
  __pid_t _Var3;
  void *in_RDX;
  long in_FS_OFFSET;
  QMessageLogger local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (__stat_loc != (void *)0x0) {
    SVar2 = QReadWriteLockPrivate::stateForWaitCondition((QReadWriteLock *)__stat_loc);
    if (SVar2 != Unlocked) {
      if (SVar2 == RecursivelyLocked) {
        local_58.context.version = 2;
        local_58.context.function._4_4_ = 0;
        local_58.context._4_8_ = 0;
        local_58.context._12_8_ = 0;
        local_58.context.category = "default";
        _Var3 = 0;
        QMessageLogger::warning
                  (&local_58,
                   "QWaitCondition: cannot wait on QReadWriteLocks with recursive lockForWrite()");
      }
      else {
        code = pthread_mutex_lock((pthread_mutex_t *)this->d);
        qt_report_pthread_error(code,"QWaitCondition::wait()","mutex lock");
        piVar1 = &this->d->waiters;
        *piVar1 = *piVar1 + 1;
        QReadWriteLock::unlock((QReadWriteLock *)__stat_loc);
        _Var3 = QWaitConditionPrivate::wait(this->d,in_RDX);
        if (SVar2 == LockedForWrite) {
          QReadWriteLock::lockForWrite((QReadWriteLock *)__stat_loc);
        }
        else {
          QReadWriteLock::lockForRead((QReadWriteLock *)__stat_loc);
        }
      }
      goto LAB_00386ab4;
    }
  }
  _Var3 = 0;
LAB_00386ab4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return _Var3;
  }
  __stack_chk_fail();
}

Assistant:

bool QWaitCondition::wait(QReadWriteLock *readWriteLock, QDeadlineTimer deadline)
{
    using namespace QReadWriteLockStates;

    if (!readWriteLock)
        return false;
    auto previousState = QReadWriteLockPrivate::stateForWaitCondition(readWriteLock);
    if (previousState == Unlocked)
        return false;
    if (previousState == RecursivelyLocked) {
        qWarning("QWaitCondition: cannot wait on QReadWriteLocks with recursive lockForWrite()");
        return false;
    }

    qt_report_pthread_error(pthread_mutex_lock(&d->mutex), "QWaitCondition::wait()", "mutex lock");
    ++d->waiters;

    readWriteLock->unlock();

    bool returnValue = d->wait(deadline);

    if (previousState == LockedForWrite)
        readWriteLock->lockForWrite();
    else
        readWriteLock->lockForRead();

    return returnValue;
}